

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.cpp
# Opt level: O3

json_array * __thiscall
json_deserializer::deserialize_array(json_array *__return_storage_ptr__,json_deserializer *this)

{
  vector<json_element_*,_std::allocator<json_element_*>_> *this_00;
  char cVar1;
  pointer pcVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  char cVar8;
  json_object jsonObject;
  json_object *local_70;
  undefined1 local_68 [24];
  _Base_ptr local_50 [4];
  
  (__return_storage_ptr__->super_json_element)._vptr_json_element =
       (_func_int **)&PTR_get_type_0012da90;
  this_00 = &__return_storage_ptr__->values;
  (__return_storage_ptr__->values).
  super__Vector_base<json_element_*,_std::allocator<json_element_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->values).
  super__Vector_base<json_element_*,_std::allocator<json_element_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).
  super__Vector_base<json_element_*,_std::allocator<json_element_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar4 = (ulong)(uint)(this->reader).index;
  uVar5 = (this->reader).cbuf._M_string_length;
  while( true ) {
    iVar7 = (int)uVar4 + 1;
    uVar6 = (ulong)iVar7;
    if (uVar6 < uVar5) {
      (this->reader).index = iVar7;
    }
    else {
      uVar6 = (ulong)(int)uVar4;
    }
    if ((this->reader).cbuf._M_dataplus._M_p[uVar6] == ']') {
      return __return_storage_ptr__;
    }
    uVar3 = current_deserialization_type(this);
    if ((uVar3 & 2) == 0) {
      uVar3 = current_deserialization_type(this);
      if ((uVar3 & 1) == 0) {
        uVar3 = current_deserialization_type(this);
        if ((uVar3 & 4) == 0) {
          uVar3 = current_deserialization_type(this);
          if ((uVar3 & 0x10) == 0) {
            uVar3 = current_deserialization_type(this);
            if ((uVar3 & 8) == 0) {
              uVar3 = current_deserialization_type(this);
              if ((uVar3 & 0x20) != 0) {
                deserialize_json_object((json_object *)local_68,this);
                local_70 = (json_object *)local_68;
                std::vector<json_element*,std::allocator<json_element*>>::emplace_back<json_object*>
                          ((vector<json_element*,std::allocator<json_element*>> *)this_00,&local_70)
                ;
                json_object::~json_object((json_object *)local_68);
              }
            }
            else {
              uVar3 = current_deserialization_type(this);
              if ((uVar3 & 0x40) == 0) {
                uVar3 = current_deserialization_type(this);
                if ((char)uVar3 < '\0') {
                  deserialize_bool_false((json_deserializer *)local_68);
                  local_70 = (json_object *)local_68;
                  std::vector<json_element*,std::allocator<json_element*>>::emplace_back<json_bool*>
                            ((vector<json_element*,std::allocator<json_element*>> *)this_00,
                             (json_bool **)&local_70);
                }
              }
              else {
                deserialize_bool_true((json_deserializer *)local_68);
                local_70 = (json_object *)local_68;
                std::vector<json_element*,std::allocator<json_element*>>::emplace_back<json_bool*>
                          ((vector<json_element*,std::allocator<json_element*>> *)this_00,
                           (json_bool **)&local_70);
              }
            }
          }
          else {
            deserialize_array((json_array *)local_68,this);
            local_70 = (json_object *)local_68;
            std::vector<json_element*,std::allocator<json_element*>>::emplace_back<json_array*>
                      ((vector<json_element*,std::allocator<json_element*>> *)this_00,
                       (json_array **)&local_70);
            json_array::~json_array((json_array *)local_68);
          }
        }
        else {
          deserialize_number((json_deserializer *)local_68);
          local_70 = (json_object *)local_68;
          std::vector<json_element*,std::allocator<json_element*>>::emplace_back<json_number*>
                    ((vector<json_element*,std::allocator<json_element*>> *)this_00,
                     (json_number **)&local_70);
        }
      }
      else {
        deserialize_null((json_deserializer *)local_68);
        local_70 = (json_object *)local_68;
        std::vector<json_element*,std::allocator<json_element*>>::emplace_back<json_null*>
                  ((vector<json_element*,std::allocator<json_element*>> *)this_00,
                   (json_null **)&local_70);
      }
    }
    else {
      deserialize_str((json_str *)local_68,this);
      local_70 = (json_object *)local_68;
      std::vector<json_element*,std::allocator<json_element*>>::emplace_back<json_str*>
                ((vector<json_element*,std::allocator<json_element*>> *)this_00,
                 (json_str **)&local_70);
      local_68._0_8_ = &PTR_get_type_0012d9c0;
      if ((_Base_ptr *)local_68._8_8_ != local_50) {
        operator_delete((void *)local_68._8_8_,(ulong)((long)&local_50[0]->_M_color + 1));
      }
    }
    uVar4 = (ulong)(this->reader).index;
    pcVar2 = (this->reader).cbuf._M_dataplus._M_p;
    uVar5 = (this->reader).cbuf._M_string_length;
    cVar1 = pcVar2[uVar4];
    uVar6 = uVar4 + 1;
    cVar8 = cVar1;
    if (uVar6 < uVar5) {
      (this->reader).index = (int)uVar6;
      cVar8 = pcVar2[uVar6];
      uVar4 = uVar6 & 0xffffffff;
    }
    if (cVar8 == ']') break;
    if (cVar1 == ']') {
      return __return_storage_ptr__;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

json_array deserialize_array() {
        json_array array = json_array();

        bool hasNext = true;
        while (hasNext) {
            reader.next();

            if (reader.current() == closing_array) {
                return array;
            }

            if ((current_deserialization_type() & g_json_str) != 0) {
                json_str jsonStr = deserialize_str();
                array.vlist() -> emplace_back(&jsonStr);
            } else if ((current_deserialization_type() & g_json_null) != 0) {
                json_null jsonNull = deserialize_null();
                array.vlist() -> emplace_back(&jsonNull);
            } else if ((current_deserialization_type() & g_json_number) != 0) {
                json_number jsonNumber = deserialize_number();
                array.vlist() -> emplace_back(&jsonNumber);
            } else if ((current_deserialization_type() & g_json_array) != 0) {
                json_array jsonArray = deserialize_array();
                array.vlist() -> emplace_back(&jsonArray);
            } else if ((current_deserialization_type() & g_json_bool) != 0) {
                if ((current_deserialization_type() & g_json_true) != 0) {
                    json_bool jsonBool = deserialize_bool_true();
                    array.vlist() -> emplace_back(&jsonBool);
                } else if ((current_deserialization_type() & g_json_false) != 0) {
                    json_bool jsonBool = deserialize_bool_false();
                    array.vlist() -> emplace_back(&jsonBool);
                }
            } else if ((current_deserialization_type() & g_json_object) != 0) {
                json_object jsonObject = deserialize_json_object();
                array.vlist() -> emplace_back(&jsonObject);
            } else {
                // eat it up
            }

            if (reader.current() == closing_array) {
                hasNext = false;
            }
            reader.next();
            if (reader.current() == closing_array) {
                hasNext = false;
            }
        }

        return array;
    }